

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderStairs<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLinLog>
               (GetterXsYs<unsigned_long_long> *getter,TransformerLinLog *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  ImVec2 IVar3;
  ImPlotPlot *pIVar4;
  ImPlotContext *pIVar5;
  ImDrawList *this;
  long lVar6;
  int iVar7;
  int iVar8;
  ImPlotContext *gp;
  ImPlotContext *pIVar9;
  double dVar10;
  double dVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  ImVec2 p12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_90;
  undefined1 local_88 [24];
  ImDrawList *local_70;
  ImVec2 local_68;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  TransformerLinLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar9 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  local_70 = DrawList;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar7 = getter->Count;
    local_48 = iVar7 + -1;
    local_40 = line_weight * 0.5;
    lVar6 = (long)((getter->Offset % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
    uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar6);
    dVar11 = (double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25;
    local_88._8_8_ = dVar11 + dVar11;
    local_88._0_8_ = dVar11 + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    uVar2 = *(unsigned_long_long *)((long)getter->Ys + lVar6);
    auVar15._8_4_ = (int)(uVar2 >> 0x20);
    auVar15._0_8_ = uVar2;
    auVar15._12_4_ = 0x45300000;
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    dVar10 = log10(((auVar15._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                   pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar7 = transformer->YAxis;
    pIVar4 = pIVar9->CurrentPlot;
    dVar11 = pIVar4->YAxis[iVar7].Range.Min;
    IVar3 = pIVar9->PixelRange[iVar7].Min;
    local_3c.x = (float)(pIVar9->Mx * ((double)local_88._0_8_ - (pIVar4->XAxis).Range.Min) +
                        (double)IVar3.x);
    local_3c.y = (float)(pIVar9->My[iVar7] *
                         (((double)(float)(dVar10 / pIVar9->LogDenY[iVar7]) *
                           (pIVar4->YAxis[iVar7].Range.Max - dVar11) + dVar11) - dVar11) +
                        (double)IVar3.y);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLinLog>>
              ((StairsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLog> *)
               local_58,local_70,&pIVar4->PlotRect);
  }
  else {
    iVar7 = getter->Count;
    lVar6 = (long)((getter->Offset % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
    uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar6);
    dVar11 = (double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25;
    local_88._8_4_ = SUB84(dVar11 + dVar11,0);
    local_88._0_8_ = dVar11 + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    local_88._12_4_ = (int)((ulong)(dVar11 + dVar11) >> 0x20);
    uVar2 = *(unsigned_long_long *)((long)getter->Ys + lVar6);
    dVar10 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                   pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar7 = transformer->YAxis;
    pIVar4 = pIVar9->CurrentPlot;
    dVar11 = pIVar4->YAxis[iVar7].Range.Min;
    IVar3 = pIVar9->PixelRange[iVar7].Min;
    local_58._0_4_ =
         (undefined4)
         (pIVar9->Mx * ((double)local_88._0_8_ - (pIVar4->XAxis).Range.Min) + (double)IVar3.x);
    local_58._4_4_ =
         (undefined4)
         (pIVar9->My[iVar7] *
          (((double)(float)(dVar10 / pIVar9->LogDenY[iVar7]) *
            (pIVar4->YAxis[iVar7].Range.Max - dVar11) + dVar11) - dVar11) + (double)IVar3.y);
    iVar7 = getter->Count;
    if (1 < iVar7) {
      iVar8 = 1;
      local_60 = pIVar9;
      do {
        pIVar5 = GImPlot;
        lVar6 = (long)(((getter->Offset + iVar8) % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
        uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar6);
        dVar11 = (double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25;
        local_88._8_4_ = SUB84(dVar11 + dVar11,0);
        local_88._0_8_ = dVar11 + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
        local_88._12_4_ = (int)((ulong)(dVar11 + dVar11) >> 0x20);
        uVar2 = *(unsigned_long_long *)((long)getter->Ys + lVar6);
        dVar10 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25)
                       + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                       GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        this = local_70;
        iVar7 = transformer->YAxis;
        pIVar4 = pIVar5->CurrentPlot;
        dVar11 = pIVar4->YAxis[iVar7].Range.Min;
        IVar3 = pIVar5->PixelRange[iVar7].Min;
        fVar12 = (float)(pIVar5->Mx * ((double)local_88._0_8_ - (pIVar4->XAxis).Range.Min) +
                        (double)IVar3.x);
        fVar13 = (float)(pIVar5->My[iVar7] *
                         (((double)(float)(dVar10 / pIVar5->LogDenY[iVar7]) *
                           (pIVar4->YAxis[iVar7].Range.Max - dVar11) + dVar11) - dVar11) +
                        (double)IVar3.y);
        local_68.y = fVar13;
        local_68.x = fVar12;
        pIVar4 = pIVar9->CurrentPlot;
        fVar14 = (float)local_58._4_4_;
        if (fVar13 <= (float)local_58._4_4_) {
          fVar14 = fVar13;
        }
        if ((fVar14 < (pIVar4->PlotRect).Max.y) &&
           (fVar14 = (float)(~-(uint)(fVar13 <= (float)local_58._4_4_) & (uint)fVar13 |
                            -(uint)(fVar13 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar14 && fVar14 != *pfVar1)) {
          fVar14 = (float)local_58._0_4_;
          if (fVar12 <= (float)local_58._0_4_) {
            fVar14 = fVar12;
          }
          if ((fVar14 < (pIVar4->PlotRect).Max.x) &&
             (fVar14 = (float)(-(uint)(fVar12 <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(fVar12 <= (float)local_58._0_4_) & (uint)fVar12),
             (pIVar4->PlotRect).Min.x <= fVar14 && fVar14 != (pIVar4->PlotRect).Min.x)) {
            local_90.y = (float)local_58._4_4_;
            local_90.x = fVar12;
            ImDrawList::AddLine(local_70,(ImVec2 *)local_58,&local_90,col,line_weight);
            pIVar9 = local_60;
            ImDrawList::AddLine(this,&local_90,&local_68,col,line_weight);
          }
        }
        iVar8 = iVar8 + 1;
        iVar7 = getter->Count;
        local_58 = (undefined1  [8])local_68;
      } while (iVar8 < iVar7);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}